

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
     *this,int i)

{
  double dVar1;
  double *pdVar2;
  long in_RDI;
  Fad<double> *this_00;
  value_type vVar3;
  int in_stack_ffffffffffffffbc;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  *in_stack_ffffffffffffffc0;
  double dVar4;
  double dVar5;
  
  this_00 = (Fad<double> *)
            FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
            ::dx(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pdVar2 = Fad<double>::val(*(Fad<double> **)(in_RDI + 8));
  dVar5 = *pdVar2;
  pdVar2 = Fad<double>::dx(this_00,(int)((ulong)dVar5 >> 0x20));
  dVar4 = *pdVar2;
  vVar3 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                 *)0x1ec43d0);
  pdVar2 = Fad<double>::val(*(Fad<double> **)(in_RDI + 8));
  dVar1 = *pdVar2;
  pdVar2 = Fad<double>::val(*(Fad<double> **)(in_RDI + 8));
  return ((double)this_00 * dVar5 + -(dVar4 * vVar3)) / (dVar1 * *pdVar2);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}